

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

void __thiscall pg::RTLSolver::~RTLSolver(RTLSolver *this)

{
  RTLSolver *this_local;
  
  ~RTLSolver(this);
  operator_delete(this,0x208);
  return;
}

Assistant:

RTLSolver::~RTLSolver()
{
}